

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O3

void __thiscall
solitaire::events::EventsProcessorTests::ignoreLeftButtonUpOnFoundationPilesFromFirstTo
          (EventsProcessorTests *this,uint pilesToIgnore)

{
  bool bVar1;
  TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  *this_00;
  ActionInterface<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  *impl;
  TypedExpectation<bool_(const_solitaire::geometry::Position_&)> *this_01;
  ActionInterface<bool_(const_solitaire::geometry::Position_&)> *impl_00;
  uint uVar2;
  PileId local_a4;
  bool *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  ContextMock *local_90;
  _Any_data local_88;
  code *local_78;
  MatcherBase<const_solitaire::geometry::Position_&> local_68;
  MockSpec<bool_(const_solitaire::geometry::Position_&)> local_50;
  
  if (pilesToIgnore != 0) {
    local_90 = &(this->contextMock).super_ContextMock;
    uVar2 = 0;
    do {
      local_a4.t = uVar2;
      testing::Matcher<solitaire::piles::PileId>::Matcher
                ((Matcher<solitaire::piles::PileId> *)&local_68,&local_a4);
      ContextMock::gmock_getFoundationPileCollider
                ((MockSpec<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                  *)&local_50,local_90,(Matcher<solitaire::piles::PileId> *)&local_68);
      testing::internal::GetWithoutMatchers();
      this_00 = testing::internal::
                MockSpec<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                ::InternalExpectedAt
                          ((MockSpec<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                            *)&local_50,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                           ,0x58,"contextMock","getFoundationPileCollider(id)");
      impl = (ActionInterface<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
              *)operator_new(0x10);
      impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00322940;
      impl[1]._vptr_ActionInterface = (_func_int **)&this->foundationPileColliderMock;
      testing::
      Action<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>::
      Action((Action<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
              *)&local_88,impl);
      testing::internal::
      TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
      ::WillOnce(this_00,(Action<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                          *)&local_88);
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase
                ((MatcherBase<solitaire::piles::PileId> *)&local_50.matchers_);
      testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase
                ((MatcherBase<solitaire::piles::PileId> *)&local_68);
      local_68.vtable_ =
           (VTable *)
           testing::internal::MatcherBase<solitaire::geometry::Position_const&>::
           GetVTable<testing::internal::MatcherBase<solitaire::geometry::Position_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
           ::kVTable;
      local_68.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherBase_00318cb0;
      colliders::FoundationPileColliderMock::gmock_collidesWithCardsInHand
                (&local_50,&(this->foundationPileColliderMock).super_FoundationPileColliderMock,
                 (Matcher<const_solitaire::geometry::Position_&> *)&local_68);
      testing::internal::GetWithoutMatchers();
      this_01 = testing::internal::MockSpec<bool_(const_solitaire::geometry::Position_&)>::
                InternalExpectedAt(&local_50,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                                   ,0x5a,"foundationPileColliderMock","collidesWithCardsInHand(_)");
      local_a0 = (bool *)operator_new(1);
      *local_a0 = false;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_98,local_a0);
      impl_00 = (ActionInterface<bool_(const_solitaire::geometry::Position_&)> *)operator_new(0x10);
      impl_00->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00323800;
      bVar1 = *local_a0;
      *(bool *)&impl_00[1]._vptr_ActionInterface = bVar1;
      *(bool *)((long)&impl_00[1]._vptr_ActionInterface + 1) = bVar1;
      testing::Action<bool_(const_solitaire::geometry::Position_&)>::Action
                ((Action<bool_(const_solitaire::geometry::Position_&)> *)&local_88,impl_00);
      testing::internal::TypedExpectation<bool_(const_solitaire::geometry::Position_&)>::WillOnce
                (this_01,(Action<bool_(const_solitaire::geometry::Position_&)> *)&local_88);
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
      }
      testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase
                ((MatcherBase<const_solitaire::geometry::Position_&> *)&local_50.matchers_);
      testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase(&local_68)
      ;
      uVar2 = uVar2 + 1;
    } while (pilesToIgnore != uVar2);
  }
  return;
}

Assistant:

void ignoreLeftButtonUpOnFoundationPilesFromFirstTo(unsigned pilesToIgnore) {
        for (PileId id {0}; id < pilesToIgnore; ++id) {
            EXPECT_CALL(contextMock, getFoundationPileCollider(id))
                .WillOnce(ReturnRef(foundationPileColliderMock));
            EXPECT_CALL(foundationPileColliderMock, collidesWithCardsInHand(_))
                .WillOnce(Return(false));
        }
    }